

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parser.cpp
# Opt level: O0

void __thiscall franca::ModelParser::ModelParser(ModelParser *this)

{
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::detail::function_ptr<void,_void_(*)(const_char_*,_const_char_*,_const_char_*,_const_boost::spirit::info_&)>_>,_0L>,_boost::phoenix::actor<boost::spirit::argument<0>_>,_boost::phoenix::actor<boost::spirit::argument<1>_>,_boost::phoenix::actor<boost::spirit::argument<2>_>,_boost::phoenix::actor<boost::spirit::argument<3>_>_>,_5L>_>
  f;
  Rule<ast::TypeCollection_()> *tuple;
  type *ptVar1;
  actor<boost::spirit::argument<0>_> *paVar2;
  proto_child0 a1;
  actor<boost::spirit::attribute<0>_> *tuple_00;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_00;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<3>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_01;
  string *name;
  phoenix *ppVar3;
  actor<boost::spirit::argument<2>_> *in_R9;
  proto_child0 r;
  bool_<false> local_5e6b;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  local_5e6a;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  local_5e68;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_1L>
  local_5e58;
  bool_<false> local_5e4b;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  local_5e4a;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  local_5e48;
  bool_<false> local_5e33;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  local_5e32;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>
  local_5e30;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>
  local_5e28;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_1L>_&>,_2L>
  local_5e18;
  expr<_25b96702_> local_5e08;
  char local_5df1;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5df0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::raw>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  local_5de0;
  char local_5dca [2];
  expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5dc8;
  expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>
  local_5db8;
  char local_5da9;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>
  local_5da8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5d98;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  local_5d88;
  char local_5d71;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::InitializerParser_&>,_2L>
  local_5d70;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::InitializerParser_&>,_2L>_&>,_1L>
  local_5d60;
  bool_<false> local_5d56;
  terminal<boost::spirit::tag::lit> local_5d55 [2];
  bool_<false> local_5d53;
  terminal<boost::spirit::tag::lit> local_5d52 [2];
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  local_5d50;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>
  local_5d40;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<franca::TypeParser_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>
  local_5d30;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<franca::TypeParser_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_5d20;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<franca::TypeParser_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::InitializerParser_&>,_2L>_&>,_1L>_&>,_2L>
  local_5d10;
  char local_5cff;
  bool_<false> local_5cfe;
  terminal<boost::spirit::tag::lit> local_5cfd [2];
  bool_<false> local_5cfb;
  terminal<boost::spirit::tag::lit> local_5cfa [2];
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  local_5cf8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>
  local_5ce8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_franca::TypeParser_&>,_2L>
  local_5cd8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_franca::TypeParser_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>
  local_5cc8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_franca::TypeParser_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_5cb8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_franca::TypeParser_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5ca8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_franca::TypeParser_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_franca::InitializerParser_&>,_2L>
  local_5c98;
  char local_5c82 [2];
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5c80;
  undefined1 local_5c71;
  type local_5c70;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5c60;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_5c50;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5c40;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>
  local_5c30;
  char local_5c21;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>_>,_2L>
  local_5c20;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>
  local_5c10;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_5c00;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>_>,_2L>_&>,_2L>
  local_5bf0;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5be0;
  expr<_429e18c8_> local_5bd0;
  expr<_8d29f5c8_> local_5bc0;
  char local_5ba9;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::ExpressionParser_&>,_2L>
  local_5ba8;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::ExpressionParser_&>,_2L>_&>,_1L>
  local_5b98;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::ExpressionParser_&>,_2L>_&>,_1L>_&>,_2L>
  local_5b90;
  char local_5b79;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5b78;
  char local_5b69;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_5b68;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5b58;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  local_5b48;
  char local_5b31;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_5b30;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_1L>
  local_5b20;
  char local_5b11;
  Rule<ast::Argument_()> *local_5b10;
  undefined1 local_5b01;
  type local_5b00;
  type *local_5af0;
  undefined1 *local_5ae8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_5ae0;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5ad0;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>
  local_5ac0;
  undefined1 local_5ab1;
  Rule<ast::Argument_()> *local_5ab0;
  undefined1 local_5aa1;
  type local_5aa0;
  type *local_5a90;
  undefined1 *local_5a88;
  type **local_5a80;
  Rule<ast::Argument_()> **local_5a78;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5a70;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>
  local_5a60;
  char local_5a51;
  undefined1 *local_5a50;
  char *local_5a48;
  char *local_5a40;
  AnnotationGrammar *local_5a38;
  char **local_5a30;
  Rule<std::string_()> *local_5a28;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[14]>,_0L>_>,_2L>_&>,_2L>
  local_5a20;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[14]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5a10;
  expr<_ee78f599_> local_5a00;
  expr<_138cea49_> local_59f0;
  expr<_332f940a_> local_59e0;
  expr<_b99c0310_> local_59d0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>_>,_2L>
  local_59c0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>_>,_2L>
  local_59b0;
  bool_<false> local_599e;
  terminal<boost::spirit::tag::lit> local_599d [2];
  bool_<false> local_599b;
  terminal<boost::spirit::tag::lit> local_599a [2];
  undefined1 local_5998 [16];
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_franca::TypeParser_&>,_2L>
  local_5988;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>
  local_5978;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_franca::TypeParser_&>,_2L>
  local_5968;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_franca::TypeParser_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>
  local_5958;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_franca::TypeParser_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_5948;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_franca::TypeParser_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>_>,_2L>_&>,_2L>
  local_5938;
  expr<_d8dee815_> local_5928;
  char local_5911;
  type local_5910;
  type local_5900;
  undefined1 local_58e9;
  type local_58e8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_58d8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>_&>,_2L>
  local_58c8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_58b8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>_&>,_2L>
  local_58a8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_5898;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5888;
  char local_5871;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5870;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionParser_&>,_1L>
  local_5868;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<franca::ContractParser_&>,_1L>
  local_5860;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5858;
  Rule<ast::Method_()> *local_5850;
  Rule<ast::Attribute_()> *local_5848;
  Rule<ast::Version_()> *local_5840;
  undefined1 local_5832;
  undefined1 local_5831;
  Rule<std::string_()> *local_5830;
  undefined1 *local_5828;
  char *local_5820;
  Rule<std::string_()> **local_5818;
  char **local_5810;
  char *local_5808;
  Rule<std::string_()> *local_5800;
  char **local_57f8;
  char *local_57f0;
  AnnotationGrammar *local_57e8;
  char **local_57e0;
  Rule<std::string_()> *local_57d8;
  char ***local_57d0;
  char ***local_57c8;
  char ****local_57c0;
  char ***local_57b8;
  undefined8 ****local_57b0;
  undefined1 *local_57a8;
  undefined8 *****local_57a0;
  Rule<ast::Version_()> **local_5798;
  undefined8 *****local_5790;
  Rule<ast::Attribute_()> **local_5788;
  expr<_da88b053_> local_5780;
  expr<_7994dce3_> local_5770;
  expr<_fd729d45_> local_5760;
  expr<_8f025098_> local_5750;
  expr<_b098d368_> local_5740;
  expr<_bbea5d68_> local_5730;
  char local_5719;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5718;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionParser_&>,_1L>
  local_5710;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5708;
  char local_56f9;
  Rule<std::string_()> *local_56f8;
  char *local_56f0;
  AnnotationGrammar *local_56e8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_56e0;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_56d0;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_56c0;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionParser_&>,_1L>_&>,_2L>
  local_56b0;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionParser_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_56a0;
  expr<_3995c0c_> local_5690;
  type local_5680;
  type *local_5670;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&>,_1L>_&>,_2L>
  local_5668;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  local_5658;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&>,_2L>
  local_5648;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  local_5638;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>_&>,_2L>
  local_5628;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_5618;
  undefined1 local_55fe [6];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<3>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_&>,_2L>
  local_55f8;
  undefined1 local_55de [6];
  actor<boost::spirit::attribute<0>_> *local_55d8;
  proto_child0 local_55d0;
  actor<boost::spirit::attribute<0>_> **local_55c8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<3>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_&>,_2L>
  *local_55c0;
  actor<boost::spirit::attribute<0>_> ***local_55b8 [2];
  type local_55a6;
  Rule<std::string_()> *local_55a0;
  undefined1 *local_5598;
  Rule<std::string_()> **local_5590 [2];
  undefined1 local_557d [2];
  undefined1 local_557b [3];
  Rule<std::string_()> *local_5578;
  proto_child0 local_5570;
  char *local_5568 [2];
  actor<boost::spirit::attribute<0>_> *local_5558;
  actor<boost::spirit::argument<0>_> *local_5550;
  expr<_ec7db31e_> local_5548;
  expr<_378b6109_> local_5538;
  allocator local_5521;
  string local_5520;
  allocator local_54f9;
  string local_54f8;
  allocator local_54d1;
  string local_54d0;
  allocator local_54a9;
  string local_54a8;
  allocator local_5481;
  string local_5480;
  allocator local_5459;
  string local_5458;
  allocator local_5431;
  string local_5430;
  allocator local_5409;
  string local_5408;
  allocator local_53e1;
  string local_53e0;
  allocator local_53b9;
  string local_53b8;
  allocator local_5391;
  string local_5390;
  allocator local_5369;
  string local_5368;
  allocator local_5341;
  string local_5340;
  allocator local_5319;
  string local_5318;
  allocator local_52f1;
  string local_52f0;
  allocator local_52b9;
  string local_52b8;
  ModelParser *local_5298;
  ModelParser *this_local;
  undefined1 *local_5288;
  expr<_ec7db31e_> *local_5280;
  expr<_ec7db31e_> *local_5278;
  proto_child1 local_5270;
  actor<boost::spirit::attribute<0>_> ****local_5260;
  actor<boost::spirit::attribute<0>_> **local_5258;
  actor<boost::spirit::attribute<0>_> **local_5250;
  actor<boost::spirit::attribute<0>_> ****local_5248;
  actor<boost::spirit::argument<0>_> *local_5238;
  actor<boost::spirit::attribute<0>_> *local_5230;
  actor<boost::spirit::attribute<0>_> *local_5228;
  actor<boost::spirit::argument<0>_> *local_5220;
  actor<boost::spirit::argument<0>_> *local_5210;
  char *local_5208;
  char *local_5200;
  actor<boost::spirit::argument<0>_> *local_51f8;
  Rule<std::string_()> *pRStack_51e8;
  that_type that_3;
  undefined1 *local_51a8;
  that_type that;
  that_type that_6;
  undefined1 local_50e9;
  actor<boost::spirit::attribute<0>_> *paStack_50e8;
  that_type that_9;
  undefined1 local_50a9;
  proto_child0 prStack_50a8;
  that_type that_10;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  that_21;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>
  that_159;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>
  that_152;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>
  that_82;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>_>,_2L>
  that_85;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>_>,_2L>
  that_88;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[14]>,_0L>_>,_2L>
  that_94;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>_>,_2L>
  that_134;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  that_173;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::raw>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  that_176;
  expr<_25b96702_> that_183;
  undefined1 local_3e96;
  empty_env local_3e95;
  int local_3e94;
  empty_env d;
  phoenix *ppStack_3e90;
  empty_state s;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_3e6a;
  undefined1 local_3e69;
  data_param local_3e68;
  state_param local_3e60;
  phoenix *local_3e58;
  undefined1 *local_3e50;
  undefined1 local_3e44 [3];
  undefined1 local_3e41;
  expr_param local_3e40;
  undefined1 *local_3e38;
  expr_param local_3e30;
  undefined1 *local_3e28;
  undefined1 *local_3e20;
  expr_param pbStack_3e10;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_2;
  type that_1;
  expr_type that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_5;
  expr_type that_7;
  expr_type that_8;
  undefined1 local_3c31;
  proto_child0 local_3c30;
  actor<boost::spirit::attribute<0>_> **local_3c28;
  undefined1 *local_3c20;
  proto_child0 local_3c18;
  undefined1 *local_3c10;
  undefined1 local_3c01;
  proto_child0 local_3c00;
  proto_child0 *local_3bf8;
  undefined1 *local_3bf0;
  proto_child0 local_3be8;
  undefined1 *local_3be0;
  actor<boost::spirit::attribute<0>_> **ppaStack_3bd0;
  expr_type that_11;
  expr_type that_12;
  expr_type that_13;
  expr_type that_14;
  expr_type that_15;
  expr_type that_16;
  expr_type that_17;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_18;
  expr_type that_19;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_20;
  expr_type that_22;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_23;
  expr_type that_24;
  expr_type that_25;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>
  that_26;
  expr_type that_27;
  expr_type that_28;
  expr_type that_29;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_30;
  expr_type that_31;
  expr_type that_54;
  expr_type that_32;
  expr_type that_33;
  expr_type that_64;
  expr_type that_34;
  expr_type that_35;
  expr_type that_66;
  expr_type that_36;
  expr_type that_37;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_38;
  expr_type that_39;
  expr_type that_78;
  expr_type that_131;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_132;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_79;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_40;
  expr_type that_41;
  expr_type that_133;
  expr_type that_42;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_43;
  expr_type that_44;
  expr_type that_45;
  expr_type that_46;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_47;
  expr_type that_174;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_175;
  expr_type that_48;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_49;
  expr_type that_50;
  expr_type that_51;
  expr_type that_52;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_53;
  expr_type that_55;
  expr_type that_56;
  expr_type that_57;
  expr_type that_58;
  expr_type that_59;
  expr_type that_60;
  expr_type that_61;
  expr_type that_62;
  expr_type that_63;
  expr_type that_65;
  expr_type that_67;
  expr_type that_68;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_69;
  expr_type that_70;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_71;
  expr_type that_72;
  expr_type that_73;
  expr_type that_74;
  expr_type that_75;
  expr_type that_76;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_77;
  expr_type that_80;
  expr_type that_81;
  expr_type that_151;
  expr_type that_158;
  undefined1 local_1f81;
  proto_child1 local_1f80;
  undefined1 local_1f71;
  proto_child1 local_1f70;
  undefined1 local_1f61;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  *local_1f60;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  *local_1f58;
  undefined1 *local_1f50;
  proto_child1 local_1f48;
  undefined1 *local_1f40;
  proto_child1 local_1f38;
  undefined1 *local_1f30;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_franca::AnnotationGrammar_&>,_2L>_&,_franca::TypeParser_&>,_2L>
  *peStack_1f20;
  expr_type that_83;
  expr_type that_84;
  undefined1 local_1e41;
  char *local_1e40;
  char *local_1e38;
  char *local_1e30;
  undefined1 *local_1e28;
  char *local_1e20;
  char *local_1e18;
  char *local_1e10;
  undefined8 local_1e08;
  undefined8 local_1e00;
  char *local_1df8;
  char *local_1df0;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>
  that_86;
  expr_type that_87;
  undefined1 local_1d71;
  char *local_1d70;
  char *local_1d68;
  char *local_1d60;
  undefined1 *local_1d58;
  char *local_1d50;
  char *local_1d48;
  char *local_1d40;
  undefined8 local_1d38;
  undefined8 local_1d30;
  char *local_1d28;
  char *local_1d20;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>
  that_89;
  expr_type that_90;
  expr_type that_91;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_92;
  expr_type that_93;
  undefined1 local_1b81;
  char *local_1b80;
  char *local_1b78;
  char *local_1b70;
  undefined1 *local_1b68;
  char *local_1b60;
  char *local_1b58;
  char *local_1b50;
  undefined8 local_1b48;
  undefined8 local_1b40;
  char *local_1b38;
  char *local_1b30;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[14]>,_0L>
  that_95;
  expr_type that_96;
  expr_type that_97;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_98;
  expr_type that_99;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_100;
  expr_type that_101;
  expr_type that_109;
  expr_type that_141;
  expr_type that_102;
  expr_type that_103;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_104;
  expr_type that_105;
  expr_type that_106;
  expr_type that_107;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_108;
  expr_type that_139;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_140;
  expr_type that_110;
  expr_type that_142;
  expr_type that_111;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_112;
  expr_type that_143;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_144;
  expr_type that_113;
  expr_type that_145;
  expr_type that_114;
  expr_type that_115;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_116;
  expr_type that_117;
  expr_type that_118;
  expr_type that_119;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_120;
  expr_type that_121;
  expr_type that_122;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_123;
  expr_type that_124;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_125;
  expr_type that_126;
  expr_type that_127;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_128;
  expr_type that_129;
  expr_type that_130;
  undefined1 local_c91;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  undefined8 local_c58;
  undefined8 local_c50;
  char *local_c48;
  char *local_c40;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_135;
  expr_type that_136;
  expr_type that_137;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_138;
  expr_type that_146;
  expr_type that_147;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_148;
  expr_type that_149;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_150;
  expr_type that_153;
  expr_type that_154;
  expr_type that_155;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_156;
  expr_type that_157;
  expr_type that_160;
  expr_type that_161;
  expr_type that_162;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_163;
  expr_type that_164;
  expr_type that_165;
  expr_type that_166;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_167;
  expr_type that_168;
  expr_type that_169;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_170;
  expr_type that_171;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_172;
  undefined1 local_2b9;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_2b8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_2b0;
  undefined1 *local_2a8;
  undefined1 local_299;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_298;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_290;
  undefined1 *local_288;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  *local_278;
  expr_type that_177;
  expr_type that_178;
  expr_type that_179;
  expr_type that_180;
  expr_type that_181;
  expr_type that_182;
  undefined1 local_21;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_1L>_&>,_2L>
  *local_20;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_1L>_&>,_2L>
  *local_18;
  undefined1 *local_10;
  
  local_5298 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_52b8,"unnamed-grammar",&local_52b9);
  boost::spirit::qi::
  grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->
             super_grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
            ,&this->model_,&local_52b8);
  std::__cxx11::string::~string((string *)&local_52b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_52b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_52f0,"unnamed-rule",&local_52f1);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->model_,&local_52f0);
  std::__cxx11::string::~string((string *)&local_52f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_52f1);
  TypeParser::TypeParser(&this->type_);
  TypeDefinitionParser::TypeDefinitionParser(&this->type_definition_);
  ExpressionParser::ExpressionParser(&this->expression_);
  InitializerParser::InitializerParser(&this->initializer_);
  ContractParser::ContractParser(&this->contract_);
  AnnotationGrammar::AnnotationGrammar(&this->annotation_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5318,"unnamed-rule",&local_5319);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->version_,&local_5318);
  std::__cxx11::string::~string((string *)&local_5318);
  std::allocator<char>::~allocator((allocator<char> *)&local_5319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5340,"unnamed-rule",&local_5341);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->import_,&local_5340);
  std::__cxx11::string::~string((string *)&local_5340);
  std::allocator<char>::~allocator((allocator<char> *)&local_5341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5368,"unnamed-rule",&local_5369);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->attribute_,&local_5368);
  std::__cxx11::string::~string((string *)&local_5368);
  std::allocator<char>::~allocator((allocator<char> *)&local_5369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5390,"unnamed-rule",&local_5391);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->argument_,&local_5390);
  std::__cxx11::string::~string((string *)&local_5390);
  std::allocator<char>::~allocator((allocator<char> *)&local_5391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_53b8,"unnamed-rule",&local_53b9);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->error_,&local_53b8);
  std::__cxx11::string::~string((string *)&local_53b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_53b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_53e0,"unnamed-rule",&local_53e1);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->enumerator_,&local_53e0);
  std::__cxx11::string::~string((string *)&local_53e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_53e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5408,"unnamed-rule",&local_5409);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->method_,&local_5408);
  std::__cxx11::string::~string((string *)&local_5408);
  std::allocator<char>::~allocator((allocator<char> *)&local_5409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5430,"unnamed-rule",&local_5431);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->broadcast_,&local_5430);
  std::__cxx11::string::~string((string *)&local_5430);
  std::allocator<char>::~allocator((allocator<char> *)&local_5431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5458,"unnamed-rule",&local_5459);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->constant_def_,&local_5458);
  std::__cxx11::string::~string((string *)&local_5458);
  std::allocator<char>::~allocator((allocator<char> *)&local_5459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5480,"unnamed-rule",&local_5481);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_collection_,&local_5480);
  std::__cxx11::string::~string((string *)&local_5480);
  std::allocator<char>::~allocator((allocator<char> *)&local_5481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_54a8,"unnamed-rule",&local_54a9);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->interface_,&local_54a8);
  std::__cxx11::string::~string((string *)&local_54a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_54a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_54d0,"unnamed-rule",&local_54d1);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->quoted_string_,&local_54d0);
  std::__cxx11::string::~string((string *)&local_54d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_54d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_54f8,"unnamed-rule",&local_54f9);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->fqn_,&local_54f8);
  std::__cxx11::string::~string((string *)&local_54f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_54f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5520,"unnamed-rule",&local_5521);
  name = &local_5520;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->id_,name);
  std::__cxx11::string::~string((string *)&local_5520);
  std::allocator<char>::~allocator((allocator<char> *)&local_5521);
  boost::phoenix::at_c<0,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,(phoenix *)name,tuple_00);
  local_51a8 = local_557d;
  that._8_8_ = &boost::spirit::_1;
  ppVar3 = (phoenix *)&local_51a8;
  local_3e94 = 0;
  local_3e50 = &local_3e96;
  local_3e60 = &local_3e94;
  local_3e68 = &local_3e95;
  ppStack_3e90 = ppVar3;
  local_3e58 = ppVar3;
  local_3e40 = boost::proto::_::
               impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
               ::operator()(&local_3e6a,(expr_param)ppVar3,local_3e60,local_3e68);
  local_3e38 = &local_3e69;
  local_3e20 = &local_3e41;
  local_3e28 = local_3e44;
  local_5570 = (proto_child0)local_557b;
  local_5208 = "package";
  paVar2 = (actor<boost::spirit::argument<0>_> *)&local_5578;
  local_5568[0] = "package";
  local_5578 = &this->fqn_;
  local_5568[1] = (char *)paVar2;
  local_5210 = paVar2;
  local_5200 = local_5568[0];
  local_51f8 = paVar2;
  pRStack_51e8 = &this->fqn_;
  that_3.child1 = (proto_child1)local_5570;
  local_3e30 = local_3e40;
  pbStack_3e10 = local_3e40;
  that_3.child0 = local_5570;
  boost::phoenix::at_c<1,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,(actor<boost::spirit::attribute<0>_> *)"package");
  ppVar3 = (phoenix *)&boost::spirit::_1;
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<1>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            (&local_55a6,(adl_barrier *)&boost::spirit::_1,a0,paVar2);
  local_5598 = &local_55a6.proto_expr_.child1.proto_expr_.field_0x1;
  local_5590[0] = &local_55a0;
  local_5558 = (actor<boost::spirit::attribute<0>_> *)local_5568;
  paVar2 = (actor<boost::spirit::argument<0>_> *)local_5590;
  tuple = &this->type_collection_;
  local_55a0 = &this->import_;
  local_5550 = paVar2;
  local_5238 = paVar2;
  local_5230 = local_5558;
  local_5228 = local_5558;
  local_5220 = paVar2;
  boost::phoenix::at_c<2,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,local_5558);
  ppVar3 = (phoenix *)&boost::spirit::_1;
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<2>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)local_55de,(adl_barrier *)&boost::spirit::_1,a0_00,paVar2);
  a1 = (proto_child0)(local_55de + 2);
  local_3c10 = &local_3c31;
  local_3c20 = &local_50e9;
  local_3c28 = &paStack_50e8;
  local_55d8 = (actor<boost::spirit::attribute<0>_> *)tuple;
  local_55d0 = a1;
  paStack_50e8 = (actor<boost::spirit::attribute<0>_> *)tuple;
  that_9.child1 = (proto_child1)a1;
  local_3c30 = a1;
  local_3c18 = a1;
  that_9.child0 = a1;
  boost::phoenix::at_c<3,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,(actor<boost::spirit::attribute<0>_> *)tuple);
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<3>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)local_55fe,(adl_barrier *)&boost::spirit::_1,a0_01,
             (actor<boost::spirit::argument<0>_> *)a1);
  local_55f8.child1 = (proto_child1)(local_55fe + 2);
  local_3be0 = &local_3c01;
  local_3bf0 = &local_50a9;
  local_3bf8 = &prStack_50a8;
  local_55c8 = &local_55d8;
  local_55c0 = &local_55f8;
  local_55b8[0] = &local_55c8;
  local_5548.child0 = (proto_child0)&local_5558;
  local_5548.child1 = (proto_child1)local_55b8;
  local_5538.child0 = &local_5548;
  local_5288 = &boost::spirit::eoi;
  local_5538.child1 = (proto_child1)&boost::spirit::eoi;
  local_55f8.child0 = &this->interface_;
  local_5280 = local_5538.child0;
  local_5278 = local_5538.child0;
  local_5270 = local_5538.child1;
  local_5260 = (actor<boost::spirit::attribute<0>_> ****)local_5548.child1;
  local_5258 = (actor<boost::spirit::attribute<0>_> **)local_5548.child0;
  local_5250 = (actor<boost::spirit::attribute<0>_> **)local_5548.child0;
  local_5248 = (actor<boost::spirit::attribute<0>_> ****)local_5548.child1;
  prStack_50a8 = &this->interface_;
  that_10.child1 = local_55f8.child1;
  local_3c00 = (proto_child0)local_55f8.child1;
  local_3be8 = (proto_child0)local_55f8.child1;
  ppaStack_3bd0 = local_55c8;
  that_11.child0 = (proto_child0)local_55c0;
  that_11.child1 = local_55c0;
  that_10.child0 = (proto_child0)local_55f8.child1;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::operator=<_fefbaa72_>(&this->model_,&local_5538);
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_5680,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,(char (*) [3])".*"
             ,(is_false)0x0);
  local_5670 = &local_5680;
  local_5668.child1 = (proto_child1)&local_5670;
  local_5658.child0 = &local_5668;
  local_5658.child1.child0 = (proto_child0)0x1476e66;
  local_5648.child1 = &local_5658;
  local_5648.child0.child0 = (proto_child0)0x1476e5d;
  local_5638.child1 = &local_5648;
  local_5638.child0 = (proto_child0)&boost::spirit::omit;
  local_5628.child1 = &local_5638;
  local_5628.child0.child0 = (proto_child0)0x1476e56;
  local_5618.child1 = &this->quoted_string_;
  local_5618.child0 = &local_5628;
  local_5668.child0 = &this->fqn_;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->import_,&local_5618);
  local_56e8 = &this->annotation_;
  local_56f0 = "typeCollection";
  local_56f8 = &this->id_;
  local_56e0.child0 = (proto_child0)&local_56f0;
  local_56e0.child1 = (proto_child1)&local_56f8;
  local_56f9 = '{';
  local_56d0.child0 = &local_56e0;
  local_56d0.child1.child0 = &local_56f9;
  local_5708.child0 = &this->version_;
  local_56c0.child0 = &local_56d0;
  local_56c0.child1 = &local_5708;
  local_5710.child0 = &this->type_definition_;
  local_56b0.child0 = &local_56c0;
  local_56b0.child1 = &local_5710;
  local_5718.child0 = &this->constant_def_;
  local_56a0.child0 = &local_56b0;
  local_56a0.child1 = &local_5718;
  local_5719 = '}';
  local_5690.child0 = &local_56a0;
  local_5690.child1.child0 = &local_5719;
  boost::spirit::qi::operator%=(&this->type_collection_,&local_5690);
  local_57e8 = &this->annotation_;
  local_57f0 = "interface";
  local_57d8 = &this->id_;
  local_57e0 = &local_57f0;
  local_5800 = &this->fqn_;
  local_5808 = "extends";
  local_57f8 = &local_5808;
  local_57d0 = &local_57e0;
  local_57c8 = &local_57f8;
  local_5830 = &this->id_;
  local_5831 = 0x2c;
  local_5828 = &local_5831;
  local_5818 = &local_5830;
  local_5820 = "manages";
  local_5810 = &local_5820;
  local_57c0 = &local_57d0;
  local_57b8 = &local_5810;
  local_5832 = 0x7b;
  local_57b0 = &local_57c0;
  local_57a8 = &local_5832;
  local_5840 = &this->version_;
  local_57a0 = &local_57b0;
  local_5798 = &local_5840;
  local_5848 = &this->attribute_;
  local_5790 = &local_57a0;
  local_5788 = &local_5848;
  local_5850 = &this->method_;
  local_5780.child0 = (proto_child0)&local_5790;
  local_5780.child1 = (proto_child1)&local_5850;
  local_5858.child0 = &this->broadcast_;
  local_5770.child0 = &local_5780;
  local_5770.child1 = &local_5858;
  local_5860.child0 = &this->contract_;
  local_5760.child0 = &local_5770;
  local_5760.child1 = &local_5860;
  local_5868.child0 = &this->type_definition_;
  local_5750.child0 = &local_5760;
  local_5750.child1 = &local_5868;
  local_5870.child0 = &this->constant_def_;
  local_5740.child0 = &local_5750;
  local_5740.child1 = &local_5870;
  local_5871 = '}';
  local_5730.child0 = &local_5740;
  local_5730.child1.child0 = &local_5871;
  boost::spirit::qi::operator%=<_520d246e_>(&this->interface_,&local_5730);
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_58e8,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [8])"version",(is_false)0x0);
  local_58e9 = 0x7b;
  local_58d8.child0 = &local_58e8;
  local_58d8.child1.child0 = &local_58e9;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_5900,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [6])"major",(is_false)0x0);
  local_58c8.child0 = &local_58d8;
  local_58c8.child1 = &local_5900;
  local_58b8.child0 = &local_58c8;
  local_58b8.child1 = (proto_child1)&boost::spirit::int_;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_5910,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [6])"minor",(is_false)0x0);
  local_58a8.child0 = &local_58b8;
  local_58a8.child1 = &local_5910;
  local_5898.child0 = &local_58a8;
  local_5898.child1 = (proto_child1)&boost::spirit::int_;
  local_5911 = '}';
  local_5888.child0 = &local_5898;
  local_5888.child1.child0 = &local_5911;
  boost::spirit::qi::operator%=(&this->version_,&local_5888);
  local_5978.child1 = &this->annotation_;
  local_5978.child0.child0 = (proto_child0)0x1476e99;
  local_5968.child1 = &this->type_;
  local_5968.child0 = &local_5978;
  local_599b = (bool_<false>)0x5b;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_599a,&boost::spirit::lit,&local_599b);
  local_599e = (bool_<false>)0x5d;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_599d,&boost::spirit::lit,&local_599e);
  local_5998._0_8_ = local_599a;
  local_5998._8_8_ = local_599d;
  local_5988.child1 = (proto_child1)local_5998;
  local_1f30 = &local_1f81;
  local_5988.child0 = (proto_child0)&boost::spirit::matches;
  local_5958.child0 = &local_5968;
  local_5958.child1 = (proto_child1)&local_5988;
  local_5948.child1 = &this->id_;
  local_5948.child0 = &local_5958;
  local_1e40 = "readonly";
  local_1e28 = &local_1e41;
  local_1e30 = "readonly";
  local_1e18 = "readonly";
  local_1df8 = "readonly";
  local_1e00 = 0;
  local_1e08 = 0;
  local_1df0 = "readonly";
  local_1e10 = "readonly";
  local_1e20 = "readonly";
  local_1e38 = "readonly";
  local_59b0.child0 = (proto_child0)&boost::spirit::matches;
  local_59b0.child1.child0 = (proto_child0)0x1473c45;
  local_5938.child0 = &local_5948;
  local_5938.child1 = &local_59b0;
  local_1d70 = "noSubscriptions";
  local_1d58 = &local_1d71;
  local_1d60 = "noSubscriptions";
  local_1d48 = "noSubscriptions";
  local_1d28 = "noSubscriptions";
  local_1d30 = 0;
  local_1d38 = 0;
  local_1d20 = "noSubscriptions";
  local_1d40 = "noSubscriptions";
  local_1d50 = "noSubscriptions";
  local_1d68 = "noSubscriptions";
  local_59c0.child0 = (proto_child0)&boost::spirit::matches;
  local_59c0.child1.child0 = (proto_child0)0x1473c4f;
  local_5928.child0 = &local_5938;
  local_5928.child1 = &local_59c0;
  local_1f80 = local_5988.child1;
  local_1f38 = local_5988.child1;
  peStack_1f20 = local_5958.child0;
  that_83.child0 = (proto_child0)local_5958.child1;
  that_83.child1 = local_5958.child1;
  boost::spirit::qi::operator%=(&this->attribute_,&local_5928);
  local_5a38 = &this->annotation_;
  local_5a40 = "method";
  local_5a28 = &this->id_;
  local_5a30 = &local_5a40;
  local_1b80 = "fireAndForget";
  local_1b68 = &local_1b81;
  local_1b70 = "fireAndForget";
  local_1b58 = "fireAndForget";
  local_1b38 = "fireAndForget";
  local_1b40 = 0;
  local_1b48 = 0;
  local_1b30 = "fireAndForget";
  local_1b50 = "fireAndForget";
  local_1b60 = "fireAndForget";
  local_1b78 = "fireAndForget";
  local_5a50 = &boost::spirit::matches;
  local_5a48 = "fireAndForget";
  local_5a20.child0 = (proto_child0)&local_5a30;
  local_5a20.child1 = (proto_child1)&local_5a50;
  local_5a51 = '{';
  local_5a10.child0 = &local_5a20;
  local_5a10.child1.child0 = &local_5a51;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_5aa0,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [3])0x1473c7c,(is_false)0x0);
  local_5aa1 = 0x7b;
  local_5a90 = &local_5aa0;
  local_5a88 = &local_5aa1;
  local_5ab0 = &this->argument_;
  local_5a80 = &local_5a90;
  local_5a78 = &local_5ab0;
  local_5ab1 = 0x7d;
  local_5a70.child0 = (proto_child0)&local_5a80;
  local_5a70.child1.child0 = &local_5ab1;
  local_5a60.child0 = &local_5a70;
  local_5a00.child0 = &local_5a10;
  local_5a00.child1 = &local_5a60;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_5b00,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [4])0x1473c83,(is_false)0x0);
  local_5b01 = 0x7b;
  local_5af0 = &local_5b00;
  local_5ae8 = &local_5b01;
  local_5b10 = &this->argument_;
  local_5ae0.child0 = (proto_child0)&local_5af0;
  local_5ae0.child1 = (proto_child1)&local_5b10;
  local_5b11 = '}';
  local_5ad0.child0 = &local_5ae0;
  local_5ad0.child1.child0 = &local_5b11;
  local_5ac0.child0 = &local_5ad0;
  local_59f0.child0 = &local_5a00;
  local_59f0.child1 = &local_5ac0;
  local_5b30.child1 = &this->error_;
  local_5b30.child0.child0 = (proto_child0)0x1473c8b;
  local_5b20.child0 = &local_5b30;
  local_59e0.child0 = &local_59f0;
  local_59e0.child1 = &local_5b20;
  local_5b31 = '}';
  local_59d0.child0 = &local_59e0;
  local_59d0.child1.child0 = &local_5b31;
  boost::spirit::qi::operator%=<_1e8b9fce_>(&this->method_,&local_59d0);
  local_5b48.child0 = &this->fqn_;
  local_5b69 = '{';
  local_5b78.child0 = &this->enumerator_;
  local_5b68.child0.child0 = &local_5b69;
  local_5b68.child1 = &local_5b78;
  local_5b79 = '}';
  local_5b58.child0 = &local_5b68;
  local_5b58.child1.child0 = &local_5b79;
  local_5b48.child1 = &local_5b58;
  boost::spirit::qi::operator%=(&this->error_,&local_5b48);
  local_5b90.child0 = &this->id_;
  local_5ba9 = '=';
  local_5ba8.child1 = &this->expression_;
  local_5ba8.child0.child0 = &local_5ba9;
  local_5b98.child0 = &local_5ba8;
  local_5b90.child1 = &local_5b98;
  boost::spirit::qi::operator%=(&this->enumerator_,&local_5b90);
  local_5c10.child1 = &this->annotation_;
  local_5c10.child0.child0 = (proto_child0)0x1476eaa;
  local_5c00.child1 = &this->id_;
  local_5c00.child0 = &local_5c10;
  local_c90 = "selective";
  local_c78 = &local_c91;
  local_c80 = "selective";
  local_c68 = "selective";
  local_c48 = "selective";
  local_c50 = 0;
  local_c58 = 0;
  local_c40 = "selective";
  local_c60 = "selective";
  local_c70 = "selective";
  local_c88 = "selective";
  local_5c20.child0 = (proto_child0)&boost::spirit::matches;
  local_5c20.child1.child0 = (proto_child0)0x1473ca3;
  local_5bf0.child0 = &local_5c00;
  local_5bf0.child1 = &local_5c20;
  local_5c21 = '{';
  local_5be0.child0 = &local_5bf0;
  local_5be0.child1.child0 = &local_5c21;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_5c70,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [4])0x1473c83,(is_false)0x0);
  local_5c71 = 0x7b;
  local_5c60.child0 = &local_5c70;
  local_5c60.child1.child0 = &local_5c71;
  local_5c80.child0 = &this->argument_;
  local_5c50.child0 = &local_5c60;
  local_5c50.child1 = &local_5c80;
  local_5c82[1] = 0x7d;
  local_5c40.child0 = &local_5c50;
  local_5c40.child1.child0 = local_5c82 + 1;
  local_5c30.child0 = &local_5c40;
  local_5bd0.child0 = &local_5be0;
  local_5bd0.child1 = &local_5c30;
  local_5c82[0] = '}';
  local_5bc0.child0 = &local_5bd0;
  local_5bc0.child1.child0 = local_5c82;
  boost::spirit::qi::operator%=(&this->broadcast_,&local_5bc0);
  local_5cd8.child1 = &this->type_;
  local_5cd8.child0.child0 = (proto_child0)0x1476eb4;
  local_5cfb = (bool_<false>)0x5b;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_5cfa,&boost::spirit::lit,&local_5cfb);
  local_5cfe = (bool_<false>)0x5d;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_5cfd,&boost::spirit::lit,&local_5cfe);
  local_5cf8.child0 = (proto_child0)local_5cfa;
  local_5cf8.child1 = (proto_child1)local_5cfd;
  local_5ce8.child1 = &local_5cf8;
  local_1f40 = &local_1f71;
  local_5ce8.child0 = (proto_child0)&boost::spirit::matches;
  local_5cc8.child0 = &local_5cd8;
  local_5cc8.child1 = &local_5ce8;
  local_5cb8.child1 = &this->id_;
  local_5cb8.child0 = &local_5cc8;
  local_5cff = '=';
  local_5ca8.child0 = &local_5cb8;
  local_5ca8.child1.child0 = &local_5cff;
  local_5c98.child1 = &this->initializer_;
  local_5c98.child0 = &local_5ca8;
  local_1f70 = local_5ce8.child1;
  local_1f48 = local_5ce8.child1;
  boost::spirit::qi::operator%=(&this->constant_def_,&local_5c98);
  local_5d53 = (bool_<false>)0x5b;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_5d52,&boost::spirit::lit,&local_5d53);
  local_5d56 = (bool_<false>)0x5d;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_5d55,&boost::spirit::lit,&local_5d56);
  local_5d50.child0 = (proto_child0)local_5d52;
  local_5d50.child1 = (proto_child1)local_5d55;
  local_5d40.child1 = &local_5d50;
  local_1f50 = &local_1f61;
  local_5d40.child0 = (proto_child0)&boost::spirit::matches;
  local_5d30.child1 = &local_5d40;
  local_5d20.child1 = &this->id_;
  local_5d20.child0 = &local_5d30;
  local_5d71 = '=';
  local_5d70.child1 = &this->initializer_;
  local_5d70.child0.child0 = &local_5d71;
  local_5d60.child0 = &local_5d70;
  local_5d10.child0 = &local_5d20;
  local_5d10.child1 = &local_5d60;
  local_5d30.child0 = &this->type_;
  local_1f60 = local_5d40.child1;
  local_1f58 = local_5d40.child1;
  boost::spirit::qi::operator%=(&this->argument_,&local_5d10);
  local_5da9 = '\"';
  local_5dca[1] = 0x22;
  local_5dc8.child1.child0 = local_5dca + 1;
  local_5dc8.child0 = (proto_child0)&boost::spirit::standard::char_;
  local_5db8.child0 = &local_5dc8;
  local_5da8.child0.child0 = &local_5da9;
  local_5da8.child1 = &local_5db8;
  local_5dca[0] = '\"';
  local_5d98.child0 = &local_5da8;
  local_5d98.child1.child0 = local_5dca;
  local_5d88.child1 = &local_5d98;
  local_2a8 = &local_2b9;
  local_5d88.child0 = (proto_child0)&boost::spirit::lexeme;
  local_2b8 = local_5d88.child1;
  local_2b0 = local_5d88.child1;
  boost::spirit::qi::operator%=(&this->quoted_string_,&local_5d88);
  local_5df0.child0 = &this->id_;
  local_5df1 = '.';
  local_5df0.child1.child0 = &local_5df1;
  local_5de0.child1 = &local_5df0;
  local_288 = &local_299;
  local_5de0.child0 = (proto_child0)&boost::spirit::raw;
  local_298 = local_5de0.child1;
  local_290 = local_5de0.child1;
  boost::spirit::qi::operator%=(&this->fqn_,&local_5de0);
  local_5e33 = (bool_<false>)0x5e;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            ((terminal<boost::spirit::tag::lit> *)&local_5e32,&boost::spirit::lit,&local_5e33);
  local_5e30.child0 = &local_5e32;
  local_5e4b = (bool_<false>)0x5f;
  local_278 = local_5e30.child0;
  that_177.child0 = local_5e30.child0;
  boost::spirit::
  terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>
  ::operator()(&local_5e4a,&boost::spirit::standard::char_,&local_5e4b);
  local_5e48.child1 = &local_5e4a;
  local_5e48.child0 = (proto_child0)&boost::spirit::standard::alpha;
  local_5e28.child0 = &local_5e30;
  local_5e28.child1 = &local_5e48;
  local_5e6b = (bool_<false>)0x5f;
  boost::spirit::
  terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>
  ::operator()(&local_5e6a,&boost::spirit::standard::char_,&local_5e6b);
  local_5e68.child1 = &local_5e6a;
  local_5e68.child0 = (proto_child0)&boost::spirit::standard::alnum;
  local_5e58.child0 = &local_5e68;
  local_5e18.child0 = &local_5e28;
  local_5e18.child1 = &local_5e58;
  local_5e08.child1 = &local_5e18;
  local_10 = &local_21;
  local_5e08.child0 = (proto_child0)&boost::spirit::lexeme;
  local_20 = local_5e08.child1;
  local_18 = local_5e08.child1;
  boost::spirit::qi::operator%=(&this->id_,&local_5e08);
  r.child0.fp = (proto_child0)&this->model_;
  ptVar1 = boost::phoenix::
           bind<void,char_const*,char_const*,char_const*,boost::spirit::info_const&,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>
                     ((type *)error_handler,(phoenix *)&boost::spirit::_1,
                      (_func_void_char_ptr_char_ptr_char_ptr_info_ptr *)&boost::spirit::_2,
                      (actor<boost::spirit::argument<0>_> *)&boost::spirit::_3,
                      (actor<boost::spirit::argument<1>_> *)&boost::spirit::_4,in_R9,
                      (actor<boost::spirit::argument<3>_> *)r.child0.fp);
  f.proto_expr_._8_8_ = ptVar1;
  f.proto_expr_.child0.child0.fp = r.child0.fp;
  boost::spirit::qi::
  on_error<(boost::spirit::qi::error_handler_result)0,char_const*,franca::SkipGrammar,fidler::ast::Model(),boost::spirit::unused_type,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::detail::function_ptr<void,void(*)(char_const*,char_const*,char_const*,boost::spirit::info_const&)>>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>>
            ((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)r.child0.fp,f);
  return;
}

Assistant:

ModelParser::ModelParser() :
		ModelParser::base_type(model_)
{
	namespace qi = boost::spirit::qi;
	using namespace boost::spirit::qi::labels;
	using boost::phoenix::at_c;
	using boost::phoenix::push_back;

	model_
		= "package"
		> fqn_                 [at_c<0>(_val) = _1]
		> *import_             [push_back(at_c<1>(_val), _1)]
		> *( type_collection_  [push_back(at_c<2>(_val), _1)]
		   | interface_        [push_back(at_c<3>(_val), _1)]
		   )
		> qi::eoi
		;

	import_
		= "import"
		//> qi::omit["model" | (qi::lexeme[fqn_ > -qi::lit(".*")] > "from")]
		> qi::omit["model" | (fqn_ > -qi::lit(".*") > "from")]
		> quoted_string_
		;

	type_collection_
		%= "typeCollection"
		> annotation_
		> -id_
		> '{'
		> -version_
		> *type_definition_
		> *constant_def_
		> '}'
		;

	interface_
		%= "interface"
		> annotation_
		> id_
		> -("extends" > fqn_)
		> -("manages" > (id_ % ','))
		> '{'
		> -version_
		> *attribute_
		> *method_
		> *broadcast_
		> -contract_
		> *type_definition_
		> *constant_def_
		> '}'
		;

	version_
		%= qi::lit("version")
		> '{'
		> qi::lit("major") > qi::int_
		> qi::lit("minor") > qi::int_
		> '}'
		;

	attribute_
		%= "attribute"
		> annotation_
		> type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> qi::matches["readonly"]
		> qi::matches["noSubscriptions"]
		;

	method_
		%= "method"
		> annotation_
		> id_
		> qi::matches["fireAndForget"]
		> '{'
		> -(qi::lit("in")  > '{' > *argument_ > '}')
		> -(qi::lit("out") > '{' > *argument_ > '}')
		> -("error" > error_)
		> '}'
		;

	error_
		%= fqn_
		| ('{' > *enumerator_ > '}')
		;

	enumerator_
		%= id_
		>> -('=' > expression_)
		;

	broadcast_
		%= "broadcast"
		> annotation_
		> id_
		> qi::matches["selective"]
		> '{'
		> -(qi::lit("out") > '{' > *argument_ > '}')
		> '}'
		;

	constant_def_
		%= "const"
		> type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> '='
		> initializer_
		;

	argument_
		%= type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> -('=' > initializer_)
		;

	quoted_string_
		%= qi::lexeme['"' > +(qi::char_ - '"') > '"']
		;

	fqn_
		%= qi::raw[id_ % '.']
		//%= qi::lexeme[id_ % '.']
		;

	id_
		%= qi::lexeme[-qi::lit('^') >> (qi::alpha | qi::char_('_')) >> *(qi::alnum | qi::char_('_'))]
		;

	qi::on_error<qi::fail>(model_,
			boost::phoenix::bind(error_handler, _1, _2, _3, _4));
}